

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O0

CustomSection * __thiscall
Js::WebAssemblyModule::GetCustomSection
          (CustomSection *__return_storage_ptr__,WebAssemblyModule *this,uint32 index)

{
  undefined4 uVar1;
  uint32 uVar2;
  WasmCompilationException *this_00;
  List<Wasm::CustomSection,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  Type *pTVar3;
  uint32 index_local;
  WebAssemblyModule *this_local;
  
  uVar2 = GetCustomSectionCount(this);
  if (uVar2 <= index) {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    Wasm::WasmCompilationException::WasmCompilationException
              (this_00,L"Custom section index out of bounds %u",(ulong)index);
    __cxa_throw(this_00,&Wasm::WasmCompilationException::typeinfo,
                Wasm::WasmCompilationException::~WasmCompilationException);
  }
  this_01 = Memory::
            WriteBarrierPtr<JsUtil::List<Wasm::CustomSection,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
            ::operator->(&this->m_customSections);
  pTVar3 = JsUtil::
           List<Wasm::CustomSection,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(this_01,index);
  __return_storage_ptr__->name = pTVar3->name;
  uVar1 = *(undefined4 *)&pTVar3->field_0xc;
  __return_storage_ptr__->nameLength = pTVar3->nameLength;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = uVar1;
  __return_storage_ptr__->payload = pTVar3->payload;
  uVar1 = *(undefined4 *)&pTVar3->field_0x1c;
  __return_storage_ptr__->payloadSize = pTVar3->payloadSize;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar1;
  return __return_storage_ptr__;
}

Assistant:

Wasm::CustomSection
WebAssemblyModule::GetCustomSection(uint32 index) const
{
    if (index >= GetCustomSectionCount())
    {
        throw Wasm::WasmCompilationException(_u("Custom section index out of bounds %u"), index);
    }
    return m_customSections->Item(index);
}